

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O2

void __thiscall bloaty::dwarf::CU::ReadTopLevelDIE(CU *this,InfoReader *reader)

{
  uint16_t uVar1;
  pointer pAVar2;
  ulong uVar3;
  Abbrev *pAVar4;
  uint64_t uVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  pointer pAVar8;
  string_view *in_R8;
  optional<unsigned_long> stmt_list;
  DIEReader die_reader;
  allocator<char> local_cd;
  uint local_cc;
  anon_union_16_2_fba5e7b8_for_AttrValue_0 local_c8;
  undefined8 local_b8;
  mapped_type *local_b0;
  uint64_t local_a8;
  undefined1 local_a0;
  InfoReader *local_98;
  string_view local_90;
  anon_union_16_2_fba5e7b8_for_AttrValue_0 local_80;
  ulong local_70;
  DIEReader local_68;
  string local_50 [32];
  
  local_68.remaining_._M_len = (this->data_)._M_len;
  local_68.remaining_._M_str = (this->data_)._M_str;
  local_68.depth_ = 0;
  local_98 = reader;
  pAVar4 = DIEReader::ReadCode(&local_68,this);
  local_a0 = 0;
  local_b0 = &this->unit_name_;
  (this->unit_name_)._M_string_length = 0;
  local_cc = 0;
  *(this->unit_name_)._M_dataplus._M_p = '\0';
  pAVar8 = (pAVar4->attr).
           super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = (pAVar4->attr).
           super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pAVar8 == pAVar2) {
      if ((local_cc & 1) != 0) {
        if ((this->unit_name_)._M_string_length == 0) {
          iVar7 = std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(local_98->stmt_list_map_)._M_h,&local_a8);
          pmVar6 = local_b0;
          if (iVar7.
              super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            return;
          }
        }
        else {
          pmVar6 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_98->stmt_list_map_,&local_a8);
        }
        std::__cxx11::string::_M_assign((string *)pmVar6);
      }
      return;
    }
    uVar1 = pAVar8->name;
    AttrValue::ParseAttr
              ((AttrValue *)&local_80.string_,(AttrValue *)this,(CU *)(ulong)pAVar8->form,
               (uint16_t)&local_68,in_R8);
    local_b8 = local_70;
    uVar3 = local_b8;
    local_c8.uint_ = local_80.uint_;
    local_c8.string_._M_str = local_80.string_._M_str;
    local_b8._0_2_ = (short)local_70;
    local_b8 = uVar3;
    if (uVar1 == 0x2133) {
LAB_001a3341:
      if ((short)local_b8 == 0x17) {
        uVar5 = AttrValue::GetUint((AttrValue *)&local_c8.string_,this);
        this->addr_base_ = uVar5;
        uVar3 = local_b8;
      }
    }
    else if (uVar1 == 0x10) {
      if ((short)local_b8 == 0x17) {
        local_a8 = AttrValue::GetUint((AttrValue *)&local_c8.string_,this);
        local_a0 = 1;
        local_cc = (uint)CONCAT71((int7)(local_a8 >> 8),1);
        uVar3 = local_b8;
      }
    }
    else if (uVar1 == 0x72) {
      if ((short)local_b8 == 0x17) {
        uVar5 = AttrValue::GetUint((AttrValue *)&local_c8.string_,this);
        this->str_offsets_base_ = uVar5;
        uVar3 = local_b8;
      }
    }
    else {
      if (uVar1 == 0x73) goto LAB_001a3341;
      if (uVar1 == 0x74) {
        if ((short)local_b8 == 0x17) {
          uVar5 = AttrValue::GetUint((AttrValue *)&local_c8.string_,this);
          this->range_lists_base_ = uVar5;
          uVar3 = local_b8;
        }
      }
      else {
        local_b8._4_4_ = (uint)(local_70 >> 0x20);
        if (uVar1 == 0x2131) {
          if ((local_70 & 0xfffffffd00000000) == 0) {
            uVar5 = AttrValue::GetUint((AttrValue *)&local_c8.string_,this);
            this->dwo_id_ = uVar5;
            uVar3 = local_b8;
          }
        }
        else if ((uVar1 == 3) && ((local_b8._4_4_ & 0xfffffffd) == 1)) {
          local_90 = AttrValue::GetString((AttrValue *)&local_c8.string_,this);
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_50,&local_90,&local_cd);
          std::__cxx11::string::operator=((string *)local_b0,local_50);
          std::__cxx11::string::~string(local_50);
          uVar3 = local_b8;
        }
      }
    }
    local_b8 = uVar3;
    pAVar8 = pAVar8 + 1;
  } while( true );
}

Assistant:

void CU::ReadTopLevelDIE(InfoReader& reader) {
  DIEReader die_reader = GetDIEReader();
  const auto* abbrev = die_reader.ReadCode(*this);
  absl::optional<uint64_t> stmt_list;
  unit_name_.clear();
  die_reader.ReadAttributes(
      *this, abbrev, [this, &stmt_list](uint16_t tag, dwarf::AttrValue value) {
        switch (tag) {
          case DW_AT_name:
            if (value.IsString()) {
              unit_name_ = std::string(value.GetString(*this));
            }
            break;
          case DW_AT_stmt_list:
            if (value.form() == DW_FORM_sec_offset) {
              stmt_list = value.GetUint(*this);
            }
            break;
          case DW_AT_addr_base:
          case DW_AT_GNU_addr_base:
            if (value.form() == DW_FORM_sec_offset) {
              addr_base_ = value.GetUint(*this);
            }
            break;
          case DW_AT_str_offsets_base:
            if (value.form() == DW_FORM_sec_offset) {
              str_offsets_base_ = value.GetUint(*this);
            }
            break;
          case DW_AT_rnglists_base:
            if (value.form() == DW_FORM_sec_offset) {
              range_lists_base_ = value.GetUint(*this);
            }
            break;
          case DW_AT_GNU_dwo_id:
            if (value.IsUint()) {
              dwo_id_ = value.GetUint(*this);
            }
        }
      });

  if (stmt_list) {
    if (unit_name_.empty()) {
      auto iter = reader.stmt_list_map_.find(*stmt_list);
      if (iter != reader.stmt_list_map_.end()) {
        unit_name_ = iter->second;
      }
    } else {
      (reader.stmt_list_map_)[*stmt_list] = unit_name_;
    }
  }
}